

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O3

void __thiscall
pow_tests::CheckProofOfWork_test_negative_target::test_method
          (CheckProofOfWork_test_negative_target *this)

{
  bool bVar1;
  uint32_t nBits;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  Params consensus;
  check_type cVar2;
  char *local_230;
  char *local_228;
  __pthread_internal_list local_220;
  assertion_result local_210;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  undefined1 uStack_1d0;
  undefined7 uStack_1cf;
  undefined1 uStack_1c8;
  undefined7 uStack_1c7;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  undefined1 local_188 [72];
  undefined1 local_140 [128];
  uint256 local_c0 [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _List_node_base *local_28;
  
  local_28 = *(_List_node_base **)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)local_1b8,
                    (ChainType)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  local_198._0_8_ = *(undefined8 *)local_1b8._0_8_;
  local_198._8_8_ = *(undefined8 *)(local_1b8._0_8_ + 8);
  local_188._0_8_ = *(undefined8 *)(local_1b8._0_8_ + 0x10);
  local_188._8_8_ = *(undefined8 *)(local_1b8._0_8_ + 0x18);
  local_188._16_4_ = *(int *)(local_1b8._0_8_ + 0x20);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  ::_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
              *)(local_188 + 0x18),
             (_Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
              *)(local_1b8._0_8_ + 0x28));
  memcpy(local_140,(undefined8 *)(local_1b8._0_8_ + 0x58),0xf9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_40,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_1b8._0_8_ + 0x158));
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_1b8);
  UintToArith256((arith_uint256 *)local_1b8,local_c0);
  nBits = arith_uint256::GetCompact((arith_uint256 *)local_1b8,true);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5a;
  file.m_begin = (iterator)&local_1e8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1f8,msg);
  local_1d8 = 1;
  uStack_1d7 = 0;
  uStack_1d0 = 0;
  uStack_1cf = 0;
  uStack_1c8 = 0;
  uStack_1c7 = 0;
  uStack_1c0 = 0;
  _cVar2 = CHECK_PRED;
  bVar1 = CheckProofOfWork((uint256)ZEXT832(1),nBits,(Params *)local_198);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b8._24_8_ = &local_220;
  local_220.__prev = (__pthread_internal_list *)0xec1e07;
  local_220.__next = (__pthread_internal_list *)0xec1e30;
  local_1b8[8] = '\0';
  local_1b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_228 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)local_1b8,1,0,WARN,_cVar2,(size_t)&local_230,0x5a);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_unsigned_int>,_std::_Select1st<std::pair<const_uint256,_unsigned_int>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
               *)(local_188 + 0x18));
  if (*(_List_node_base **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(CheckProofOfWork_test_negative_target)
{
    const auto consensus = CreateChainParams(*m_node.args, ChainType::MAIN)->GetConsensus();
    uint256 hash;
    unsigned int nBits;
    nBits = UintToArith256(consensus.powLimit).GetCompact(true);
    hash = uint256{1};
    BOOST_CHECK(!CheckProofOfWork(hash, nBits, consensus));
}